

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_wchar_t_*const_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_wchar_t_*const_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  wchar_t **e;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
  ::convert(&local_40,(wstring *)this->m_lhs);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::stringify<wchar_t_const*>(&local_60,(Detail *)this->m_rhs,e);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }